

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

int csguide_webserver::CheckBasePath(string *base_path)

{
  int iVar1;
  char *pcVar2;
  Logger *this;
  stat file;
  string *in_stack_fffffffffffffed8;
  Logger *in_stack_fffffffffffffee0;
  allocator local_f9;
  string local_f8 [55];
  allocator local_c1;
  string local_c0 [32];
  stat local_a0;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(pcVar2,&local_a0);
  if (iVar1 == -1) {
    Logger::GetInstance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"path not exist: %s",&local_c1);
    std::__cxx11::string::c_str();
    Logger::LogErr<char_const*>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(char *)0x112895);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  else {
    if ((local_a0.st_mode & 0xf000) == 0x4000) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iVar1 = access(pcVar2,4);
      if (iVar1 != -1) {
        return 0;
      }
    }
    this = Logger::GetInstance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"path not directory or can\'t access: %s",&local_f9);
    std::__cxx11::string::c_str();
    Logger::LogErr<char_const*>(this,in_stack_fffffffffffffed8,(char *)0x112978);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  }
  return -1;
}

Assistant:

int CheckBasePath(const std::string &base_path) {
  struct stat file;
  if (stat(base_path.c_str(), &file) == -1) {
    Logger::GetInstance().LogErr("path not exist: %s", base_path.c_str());
    return -1;
  }
  // 不是目录 或者不可访问
  if (!S_ISDIR(file.st_mode) || access(base_path.c_str(), R_OK) == -1) {
    Logger::GetInstance().LogErr("path not directory or can't access: %s", base_path.c_str());
    return -1;
  }
  return 0;
}